

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual.c
# Opt level: O3

void build_bb_body(dill_stream c,virtual_insn *insn,int i,virtual_insn *insns)

{
  undefined4 *puVar1;
  char cVar2;
  private_ctx pdVar3;
  void *pvVar4;
  int iVar5;
  void *pvVar6;
  undefined2 *puVar7;
  long lVar8;
  long lVar9;
  basic_block_conflict local_68;
  byte local_48;
  
  pdVar3 = c->p;
  pvVar4 = pdVar3->mach_info;
  pvVar6 = *(void **)((long)pvVar4 + 0x10);
  iVar5 = *(int *)((long)pvVar4 + 8);
  lVar8 = (long)iVar5 * 0x68;
  local_68 = (basic_block_conflict)((long)pvVar6 + lVar8);
  switch(insn->class_code) {
  case '\0':
  case '\x16':
    bb_uses(c,local_68,(insn->opnds).a3.src1);
    iVar5 = (insn->opnds).a3.src2;
    break;
  case '\x01':
  case '\x02':
  case '\x04':
  case '\t':
  case '\x15':
    iVar5 = (insn->opnds).a3.src1;
    break;
  case '\x03':
    iVar5 = (insn->opnds).a3.dest;
    goto LAB_001111cf;
  case '\x05':
    bb_uses(c,local_68,(insn->opnds).a3.src1);
    iVar5 = (insn->opnds).a3.src2;
    goto LAB_001110eb;
  case '\x06':
    iVar5 = (insn->opnds).a3.src1;
LAB_001110eb:
    bb_uses(c,local_68,iVar5);
    iVar5 = (insn->opnds).a3.dest;
    if ((insn->insn_code & 0x10U) != 0) goto LAB_001111cf;
    goto LAB_00110f70;
  case '\a':
  case '\b':
    goto switchD_00110f46_caseD_7;
  default:
    goto switchD_00110f46_caseD_a;
  case '\v':
    bb_uses(c,local_68,(insn->opnds).a3.dest);
    bb_uses(c,local_68,(insn->opnds).a3.src1);
    iVar5 = (insn->opnds).a3.src2;
    goto LAB_001110d6;
  case '\f':
    bb_uses(c,local_68,(insn->opnds).a3.dest);
    iVar5 = (insn->opnds).a3.src1;
LAB_001110d6:
    local_68->end_branch_label = iVar5;
    local_68->fall_through = 1;
LAB_00111191:
    local_68->end = (long)(i + -1);
    iVar5 = *(int *)((long)pvVar4 + 8);
    *(int *)((long)pvVar4 + 8) = iVar5 + 1;
    pvVar6 = *(void **)((long)pvVar4 + 0x10);
    lVar8 = (long)iVar5 * 0x68;
LAB_00111203:
    pvVar6 = dill_realloc(pvVar6,lVar8 + 0xd0);
    *(void **)((long)pvVar4 + 0x10) = pvVar6;
    lVar8 = (long)*(int *)((long)pvVar4 + 8) * 0x68;
    local_68 = (basic_block_conflict)(lVar8 + (long)pvVar6);
    *(long *)((long)pvVar6 + lVar8) = (long)i;
    puVar1 = (undefined4 *)((long)pvVar6 + lVar8 + 8);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    *(undefined4 *)((long)pvVar6 + lVar8 + 0x18) = 0;
LAB_00111249:
    *(undefined8 *)((long)pvVar6 + lVar8 + 0x5c) = 0;
    iVar5 = c->p->vreg_count + 7 >> 3;
    puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
    *puVar7 = (short)iVar5;
    memset(puVar7 + 1,0,(long)iVar5);
    *(undefined2 **)((long)pvVar6 + lVar8 + 0x38) = puVar7;
    iVar5 = c->p->vreg_count + 7 >> 3;
    puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
    *puVar7 = (short)iVar5;
    memset(puVar7 + 1,0,(long)iVar5);
    *(undefined2 **)((long)pvVar6 + lVar8 + 0x40) = puVar7;
    goto switchD_00110f46_caseD_a;
  case '\r':
    local_68->end_branch_label = (insn->opnds).a3.src2;
    local_68->fall_through = 0;
    local_68->end = (long)(i + -1);
    *(int *)((long)pvVar4 + 8) = iVar5 + 1;
    pvVar6 = dill_realloc(pvVar6,lVar8 + 0xd0);
    *(void **)((long)pvVar4 + 0x10) = pvVar6;
    lVar8 = (long)*(int *)((long)pvVar4 + 8) * 0x68;
    local_68 = (basic_block_conflict)(lVar8 + (long)pvVar6);
    *(long *)((long)pvVar6 + lVar8) = (long)i;
    puVar1 = (undefined4 *)((long)pvVar6 + lVar8 + 8);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    *(undefined4 *)((long)pvVar6 + lVar8 + 0x18) = 0;
    goto LAB_00111249;
  case '\x0f':
    bb_uses(c,local_68,(insn->opnds).a3.dest);
    local_68->end_branch_label = -1;
    local_68->fall_through = 0;
    goto LAB_00111191;
  case '\x10':
    local_68->end_branch_label = -1;
    local_68->fall_through = 0;
    local_68->end = (long)(i + -1);
    *(int *)((long)pvVar4 + 8) = iVar5 + 1;
    goto LAB_00111203;
  case '\x11':
    iVar5 = (insn->opnds).a3.dest;
    if ((short)iVar5 < 0) goto switchD_00110f46_caseD_a;
LAB_001111cf:
    bb_uses(c,local_68,iVar5);
    goto switchD_00110f46_caseD_a;
  case '\x14':
    local_48 = insn->insn_code & 0xf;
    local_68->end_branch_label = -1;
    local_68->fall_through = 1;
    local_68->end = (long)(i + -1);
    *(int *)((long)pvVar4 + 8) = iVar5 + 1;
    pvVar6 = dill_realloc(pvVar6,(long)(iVar5 + 2) * 0x68);
    *(void **)((long)pvVar4 + 0x10) = pvVar6;
    lVar8 = (long)*(int *)((long)pvVar4 + 8) * 0x68;
    local_68 = (basic_block_conflict)(lVar8 + (long)pvVar6);
    *(long *)((long)pvVar6 + lVar8) = (long)i;
    puVar1 = (undefined4 *)((long)pvVar6 + lVar8 + 8);
    *puVar1 = 0xffffffff;
    puVar1[1] = 0xffffffff;
    puVar1[2] = 0xffffffff;
    puVar1[3] = 0xffffffff;
    *(undefined4 *)((long)pvVar6 + lVar8 + 0x18) = 0;
    *(undefined8 *)((long)pvVar6 + lVar8 + 0x5c) = 0;
    iVar5 = c->p->vreg_count + 7 >> 3;
    puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
    *puVar7 = (short)iVar5;
    memset(puVar7 + 1,0,(long)iVar5);
    *(undefined2 **)((long)pvVar6 + lVar8 + 0x38) = puVar7;
    iVar5 = c->p->vreg_count + 7 >> 3;
    puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
    *puVar7 = (short)iVar5;
    memset(puVar7 + 1,0,(long)iVar5);
    *(undefined2 **)((long)pvVar6 + lVar8 + 0x40) = puVar7;
    if (local_48 != 0xb) {
      bb_defines(c,local_68,(insn->opnds).a3.dest);
    }
    goto switchD_00110f46_caseD_a;
  }
  bb_uses(c,local_68,iVar5);
switchD_00110f46_caseD_7:
  iVar5 = (insn->opnds).a3.dest;
LAB_00110f70:
  bb_defines(c,local_68,iVar5);
switchD_00110f46_caseD_a:
  iVar5 = (pdVar3->branch_table).next_label;
  if (0 < iVar5) {
    lVar8 = 0;
    do {
      if ((long)insn + (0x28 - (long)insns) == (ulong)(uint)(pdVar3->branch_table).label_locs[lVar8]
         ) {
        if (local_68->start != (long)i) {
          cVar2 = insns[i + -1].class_code;
          local_68->end_branch_label = -1;
          local_68->fall_through = (uint)(cVar2 != '\x03' && cVar2 != '\n');
          local_68->end = (long)(i + -1);
          iVar5 = *(int *)((long)pvVar4 + 8);
          *(int *)((long)pvVar4 + 8) = iVar5 + 1;
          pvVar6 = dill_realloc(*(void **)((long)pvVar4 + 0x10),(long)iVar5 * 0x68 + 0xd0);
          *(void **)((long)pvVar4 + 0x10) = pvVar6;
          lVar9 = (long)*(int *)((long)pvVar4 + 8) * 0x68;
          local_68 = (basic_block_conflict)((long)pvVar6 + lVar9);
          *(long *)((long)pvVar6 + lVar9) = (long)i;
          puVar1 = (undefined4 *)((long)pvVar6 + lVar9 + 8);
          *puVar1 = 0xffffffff;
          puVar1[1] = 0xffffffff;
          puVar1[2] = 0xffffffff;
          puVar1[3] = 0xffffffff;
          *(undefined4 *)((long)pvVar6 + lVar9 + 0x18) = 0;
          *(undefined8 *)((long)pvVar6 + lVar9 + 0x5c) = 0;
          iVar5 = c->p->vreg_count + 7 >> 3;
          puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
          *puVar7 = (short)iVar5;
          memset(puVar7 + 1,0,(long)iVar5);
          *(undefined2 **)((long)pvVar6 + lVar9 + 0x38) = puVar7;
          iVar5 = c->p->vreg_count + 7 >> 3;
          puVar7 = (undefined2 *)dill_malloc((long)iVar5 + 2);
          *puVar7 = (short)iVar5;
          memset(puVar7 + 1,0,(long)iVar5);
          *(undefined2 **)((long)pvVar6 + lVar9 + 0x40) = puVar7;
          iVar5 = (pdVar3->branch_table).next_label;
        }
        local_68->label = (int)lVar8;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < iVar5);
  }
  return;
}

Assistant:

static void
build_bb_body(dill_stream c, virtual_insn* insn, int i, virtual_insn* insns)
{
    virtual_mach_info vmi = (virtual_mach_info)c->p->mach_info;
    basic_block bb = &vmi->bblist[vmi->bbcount];
    struct branch_table* t = &c->p->branch_table;
    int j;

    switch (insn->class_code) {
    case iclass_arith3:
    case iclass_compare:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        bb_defines(c, bb, insn->opnds.a3.dest);
        break;
    case iclass_arith3i:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_arith2:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_convert:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_lea:
        bb_uses(c, bb, insn->opnds.a3i.src);
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_loadstorei:
        bb_uses(c, bb, insn->opnds.a3i.src);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3i.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3i.dest);
        }
        break;
    case iclass_loadstore:
        bb_uses(c, bb, insn->opnds.a3.src1);
        bb_uses(c, bb, insn->opnds.a3.src2);
        if (insn->insn_code & 0x10) {
            /* store */
            bb_uses(c, bb, insn->opnds.a3.dest);
        } else {
            bb_defines(c, bb, insn->opnds.a3.dest);
        }
        break;
    case iclass_set:
        bb_defines(c, bb, insn->opnds.a3i.dest);
        break;
    case iclass_setf:
        bb_defines(c, bb, insn->opnds.sf.dest);
        break;
    case iclass_mov:
        bb_uses(c, bb, insn->opnds.a2.src);
        bb_defines(c, bb, insn->opnds.a2.dest);
        break;
    case iclass_reti:
        break;
    case iclass_ret:
        bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_branch:
        bb_uses(c, bb, insn->opnds.br.src1);
        bb_uses(c, bb, insn->opnds.br.src2);
        end_bb(bb, insn->opnds.br.label, 1);
        break;
    case iclass_branchi:
        bb_uses(c, bb, insn->opnds.bri.src);
        end_bb(bb, insn->opnds.bri.label, 1);
        break;
    case iclass_jump_to_label:
        end_bb(bb, insn->opnds.br.label, 0);
        break;
    case iclass_jump_to_reg:
        bb_uses(c, bb, insn->opnds.br.src1);
        end_bb(bb, -1, 0);
        break;
    case iclass_jump_to_imm:
        end_bb(bb, -1, 0);
        break;
    case iclass_call: {
        int typ = insn->insn_code & 0xf;
        end_bb(bb, -1, 1);
        /* put the return register definition in the next bb */
        if (typ != DILL_V) {
            bb_defines(c, bb, insn->opnds.calli.src);
        }
        break;
    }
    case iclass_push:
        if ((short)insn->opnds.a1.src >= 0)
            bb_uses(c, bb, insn->opnds.a1.src);
        break;
    case iclass_special:
        break;
    case iclass_pushi:
        break;
    case iclass_pushf:
        break;
    case iclass_nop:
    case iclass_mark_label:
        break;
    }
    for (j = 0; j < t->next_label; j++) {
        if ((unsigned)t->label_locs[j] ==
            ((char*)insn - (char*)insns) + sizeof(virtual_insn)) {
            int fall_through = 1;
            switch (insns[i - 1].class_code) {
            case iclass_ret:
            case iclass_reti:
                fall_through = 0;
            default:
                break;
            }
            if (bb->start != i) {
                end_bb(bb, -1, fall_through);
            }
            bb->label = j;
        }
    }
}